

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

void __thiscall
pugi::impl::anon_unknown_0::xpath_allocator_capture::~xpath_allocator_capture
          (xpath_allocator_capture *this)

{
  xpath_allocator *in_stack_00000008;
  xpath_allocator *in_stack_00000010;
  
  xpath_allocator::revert(in_stack_00000010,in_stack_00000008);
  return;
}

Assistant:

~xpath_allocator_capture()
		{
			_target->revert(_state);
		}